

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O1

apx_clientSocketConnection_t * apx_clientSocketConnection_new(msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_clientSocketConnection_t *self;
  
  self = (apx_clientSocketConnection_t *)malloc(0x488);
  if (self != (apx_clientSocketConnection_t *)0x0) {
    aVar1 = apx_clientSocketConnection_create(self,socket_object);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_clientSocketConnection_t *)0x0;
}

Assistant:

apx_clientSocketConnection_t *apx_clientSocketConnection_new(SOCKET_TYPE *socket_object)
{
   apx_clientSocketConnection_t *self = (apx_clientSocketConnection_t*) malloc(sizeof(apx_clientSocketConnection_t));
   if (self != 0)
   {
      apx_error_t errorCode = apx_clientSocketConnection_create(self, socket_object);
      if (errorCode != APX_NO_ERROR)
      {
         free(self);
         self = (apx_clientSocketConnection_t*) 0;
      }
   }
   return self;
}